

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_direct.cpp
# Opt level: O1

void __thiscall
direct_solvers_lower_upper_factorisation_death_test_Test::
~direct_solvers_lower_upper_factorisation_death_test_Test
          (direct_solvers_lower_upper_factorisation_death_test_Test *this)

{
  pointer puVar1;
  
  (this->super_direct_solvers).super_Test._vptr_Test = (_func_int **)&PTR__direct_solvers_00156b20;
  puVar1 = (this->super_direct_solvers).lup_solver.pivots.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1,(long)(this->super_direct_solvers).lup_solver.pivots.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar1);
  }
  std::vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>::
  ~vector(&(this->super_direct_solvers).lup_solver.lu_factorised.
           super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
         );
  puVar1 = (this->super_direct_solvers).lu_solver.pivots.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1,(long)(this->super_direct_solvers).lu_solver.pivots.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar1);
  }
  std::vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>::
  ~vector(&(this->super_direct_solvers).lu_solver.lu_factorised.
           super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
         );
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x90);
  return;
}

Assistant:

TEST_F(direct_solvers, lower_upper_factorisation_death_test) {

  // Check pivoting mis-match
  Solver_Config data;
  data.type = Solver_Type::lower_upper_factorisation;
  data.pivot = false;
  EXPECT_DEATH(Solver_LUP<0> lup(data), "./*");
  data.pivot = true;
  EXPECT_DEATH(Solver_LU<0> lup(data), "./*");

  // Check incorrect solver type
  data.type = Solver_Type::unknown;  // anything other than lower_upper_factorisation
  data.pivot = false;
  EXPECT_DEATH(Solver_LU<0> lup(data), "./*");
  data.pivot = true;
  EXPECT_DEATH(Solver_LUP<0> lup(data), "./*");

  // incorrect sizes
  Vector_Dense<Scalar, 0> b_vector = {6, 2};
  Vector_Dense<Scalar, 0> x_vector = {0, 0, 0};
  Matrix_Dense<Scalar, 0, 0> matrix = {{2, 7, 6}, {9, 5, 1}, {4, 3, 8}};
  lu_solver.factorise(matrix);
  lup_solver.factorise(matrix);
  EXPECT_DEATH(lu_solver.solve_system(x_vector, b_vector), "./*");
  EXPECT_DEATH(lup_solver.solve_system(x_vector, b_vector), "./*");
}